

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O1

void * __thiscall ncnn::UnlockedPoolAllocator::fastMalloc(UnlockedPoolAllocator *this,size_t size)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  bool bVar4;
  _List_node_base **pp_Var5;
  int iVar6;
  UnlockedPoolAllocatorPrivate *pUVar7;
  _List_node_base *p_Var8;
  _List_node_base *p_Var9;
  _List_node_base *p_Var10;
  _List_node_base *p_Var11;
  void *ptr;
  _List_node_base *local_48;
  _List_node_base *local_40;
  list<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
  *local_38;
  
  pUVar7 = this->d;
  p_Var11 = (pUVar7->budgets).
            super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  p_Var10 = p_Var11;
  p_Var9 = p_Var11;
  if (p_Var11 != (_List_node_base *)&pUVar7->budgets) {
    do {
      p_Var2 = p_Var10[1]._M_next;
      if ((p_Var2 < size) || (size < (ulong)pUVar7->size_compare_ratio * (long)p_Var2 >> 8)) {
        if (p_Var9[1]._M_next < p_Var2) {
          p_Var9 = p_Var10;
        }
        if (p_Var2 < p_Var11[1]._M_next) {
          p_Var11 = p_Var10;
        }
        bVar4 = true;
      }
      else {
        p_Var3 = p_Var10[1]._M_prev;
        psVar1 = &(pUVar7->budgets).
                  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var10,0x20);
        pUVar7 = this->d;
        local_38 = &pUVar7->payouts;
        p_Var8 = (_List_node_base *)operator_new(0x20);
        p_Var8[1]._M_next = p_Var2;
        p_Var8[1]._M_prev = p_Var3;
        local_40 = p_Var3;
        std::__detail::_List_node_base::_M_hook(p_Var8);
        psVar1 = &(pUVar7->payouts).
                  super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        bVar4 = false;
      }
      if (!bVar4) {
        return local_40;
      }
      pp_Var5 = &p_Var10->_M_next;
      pUVar7 = this->d;
      p_Var10 = *pp_Var5;
    } while (*pp_Var5 != (_List_node_base *)&pUVar7->budgets);
  }
  if (pUVar7->size_drop_threshold <=
      (pUVar7->budgets).
      super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
      ._M_impl._M_node._M_size) {
    if (p_Var9[1]._M_next < size) {
      p_Var10 = p_Var11[1]._M_prev;
      p_Var9 = p_Var11;
    }
    else {
      if (p_Var11[1]._M_next <= size) goto LAB_0013a7bb;
      p_Var10 = p_Var9[1]._M_prev;
    }
    if (p_Var10 != (_List_node_base *)0x0) {
      free(p_Var10);
    }
    psVar1 = &(this->d->budgets).
              super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var9,0x20);
  }
LAB_0013a7bb:
  local_48 = (_List_node_base *)0x0;
  iVar6 = posix_memalign(&local_48,0x40,size + 0x40);
  if (iVar6 != 0) {
    local_48 = (_List_node_base *)0x0;
  }
  p_Var11 = local_48;
  pUVar7 = this->d;
  p_Var9 = (_List_node_base *)operator_new(0x20);
  p_Var9[1]._M_next = (_List_node_base *)size;
  p_Var9[1]._M_prev = p_Var11;
  std::__detail::_List_node_base::_M_hook(p_Var9);
  psVar1 = &(pUVar7->payouts).
            super__List_base<std::pair<unsigned_long,_void_*>,_std::allocator<std::pair<unsigned_long,_void_*>_>_>
            ._M_impl._M_node._M_size;
  *psVar1 = *psVar1 + 1;
  return p_Var11;
}

Assistant:

void* UnlockedPoolAllocator::fastMalloc(size_t size)
{
    // find free budget
    std::list<std::pair<size_t, void*> >::iterator it = d->budgets.begin(), it_max = d->budgets.begin(), it_min = d->budgets.begin();
    for (; it != d->budgets.end(); ++it)
    {
        size_t bs = it->first;

        // size_compare_ratio ~ 100%
        if (bs >= size && ((bs * d->size_compare_ratio) >> 8) <= size)
        {
            void* ptr = it->second;

            d->budgets.erase(it);

            d->payouts.push_back(std::make_pair(bs, ptr));

            return ptr;
        }

        if (bs > it_max->first)
        {
            it_max = it;
        }
        if (bs < it_min->first)
        {
            it_min = it;
        }
    }

    if (d->budgets.size() >= d->size_drop_threshold)
    {
        if (it_max->first < size)
        {
            ncnn::fastFree(it_min->second);
            d->budgets.erase(it_min);
        }
        else if (it_min->first > size)
        {
            ncnn::fastFree(it_max->second);
            d->budgets.erase(it_max);
        }
    }

    // new
    void* ptr = ncnn::fastMalloc(size);

    d->payouts.push_back(std::make_pair(size, ptr));

    return ptr;
}